

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_game.cpp
# Opt level: O1

void ChangeSpy(int changespy)

{
  bool bVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  bool bVar5;
  AActor *listenactor;
  int iVar6;
  
  if (gamestate == GS_LEVEL) {
    uVar4 = (ulong)consoleplayer;
    if (*(long *)((&DAT_017e5fc8)[uVar4 * 0x54] + 0x230) == 0) {
      if (!demoplayback) {
        Net_WriteByte('B');
        return;
      }
    }
    else if ((dmflags2.Value._2_1_ & 0x10) == 0) {
      uVar3 = consoleplayer;
      if (changespy != 0) {
        if (*(long *)((&DAT_017e5fc8)[uVar4 * 0x54] + 0x230) != 0) {
          uVar4 = (ulong)(uint)((int)(*(long *)((&DAT_017e5fc8)[uVar4 * 0x54] + 0x230) - 0x17e5e50U
                                     >> 5) * 0x3cf3cf3d);
        }
        bVar5 = deathmatch.Value == 0 || demoplayback;
        iVar6 = 7;
        if (changespy == 1) {
          iVar6 = 1;
        }
        do {
          uVar3 = (int)uVar4 + iVar6 & 7;
          uVar4 = (ulong)uVar3;
          if (playeringame[uVar4] == true) {
            if (bVar5) break;
            bVar1 = AActor::IsTeammate((AActor *)(&players)[uVar4 * 0x54],
                                       (AActor *)(&players)[(long)consoleplayer * 0x54]);
            if (bVar1) break;
            if (bot_allowspy.Value == true) {
              if ((&DAT_017e5fe8)[uVar4 * 0x54] == 0) {
LAB_00388064:
                bVar1 = false;
              }
              else {
                bVar1 = true;
                if ((*(byte *)((&DAT_017e5fe8)[uVar4 * 0x54] + 0x20) & 0x20) != 0) {
                  (&DAT_017e5fe8)[uVar4 * 0x54] = 0;
                  goto LAB_00388064;
                }
              }
              if (bVar1) break;
            }
          }
        } while (uVar3 != consoleplayer);
      }
      listenactor = (AActor *)(&players)[(long)(int)uVar3 * 0x54];
      lVar2 = (long)consoleplayer;
      (&DAT_017e5fc8)[lVar2 * 0x54] = listenactor;
      if ((listenactor != (AActor *)0x0) &&
         (((listenactor->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
        (&DAT_017e5fc8)[lVar2 * 0x54] = 0;
        listenactor = (AActor *)0x0;
      }
      S_UpdateSounds(listenactor);
      (*(StatusBar->super_DObject)._vptr_DObject[10])(StatusBar,&players + (long)(int)uVar3 * 0x54);
      if ((demoplayback != false) || (multiplayer == true)) {
        DBaseStatusBar::ShowPlayerName(StatusBar);
        return;
      }
    }
  }
  return;
}

Assistant:

static void ChangeSpy (int changespy)
{
	// If you're not in a level, then you can't spy.
	if (gamestate != GS_LEVEL)
	{
		return;
	}

	// If not viewing through a player, return your eyes to your own head.
	if (players[consoleplayer].camera->player == NULL)
	{
		// When watching demos, you will just have to wait until your player
		// has done this for you, since it could desync otherwise.
		if (!demoplayback)
		{
			Net_WriteByte(DEM_REVERTCAMERA);
		}
		return;
	}

	// We may not be allowed to spy on anyone.
	if (dmflags2 & DF2_DISALLOW_SPYING)
		return;

	// Otherwise, cycle to the next player.
	bool checkTeam = !demoplayback && deathmatch;
	int pnum = consoleplayer;
	if (changespy != SPY_CANCEL) 
	{
		player_t *player = players[consoleplayer].camera->player;
		// only use the camera as starting index if it's a valid player.
		if (player != NULL) pnum = int(players[consoleplayer].camera->player - players);

		int step = (changespy == SPY_NEXT) ? 1 : -1;

		do
		{
			pnum += step;
			pnum &= MAXPLAYERS-1;
			if (playeringame[pnum] &&
				(!checkTeam || players[pnum].mo->IsTeammate (players[consoleplayer].mo) ||
				(bot_allowspy && players[pnum].Bot != NULL)))
			{
				break;
			}
		} while (pnum != consoleplayer);
	}

	players[consoleplayer].camera = players[pnum].mo;
	S_UpdateSounds(players[consoleplayer].camera);
	StatusBar->AttachToPlayer (&players[pnum]);
	if (demoplayback || multiplayer)
	{
		StatusBar->ShowPlayerName ();
	}
}